

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

void __thiscall
asio::ssl::context::set_verify_callback<asio::ssl::rfc2818_verification>
          (context *this,rfc2818_verification *callback)

{
  error_code ec;
  error_code local_50;
  string local_40 [32];
  
  local_50._M_value = 0;
  local_50._M_cat = (error_category *)std::_V2::system_category();
  std::__cxx11::string::string(local_40,(string *)callback);
  set_verify_callback<asio::ssl::rfc2818_verification>
            (this,(rfc2818_verification *)local_40,&local_50);
  std::__cxx11::string::~string(local_40);
  asio::detail::throw_error(&local_50,"set_verify_callback");
  return;
}

Assistant:

void context::set_verify_callback(VerifyCallback callback)
{
  asio::error_code ec;
  this->set_verify_callback(callback, ec);
  asio::detail::throw_error(ec, "set_verify_callback");
}